

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O3

Array __thiscall wasm::HeapType::getArray(HeapType *this)

{
  ulong uVar1;
  uintptr_t uVar2;
  undefined8 in_RDX;
  ulong *in_RSI;
  Array AVar3;
  
  uVar1 = *in_RSI;
  if ((0x7c < uVar1) && (*(int *)(uVar1 + 0x30) == 3)) {
    uVar2 = *(uintptr_t *)(uVar1 + 0x40);
    this->id = *(uintptr_t *)(uVar1 + 0x38);
    this[1].id = uVar2;
    AVar3.element._8_8_ = in_RDX;
    AVar3.element.type.id = (uintptr_t)this;
    return (Array)AVar3.element;
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x3a4,"Array wasm::HeapType::getArray() const");
}

Assistant:

constexpr bool isBasic() const { return id <= _last_basic_type; }